

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<float,_1000>::Resize(TPZManVector<float,_1000> *this,int64_t newsize,float *object)

{
  float fVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float *pfVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int64_t i;
  long lVar11;
  double dVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  if (-1 < newsize) {
    lVar11 = (this->super_TPZVec<float>).fNElements;
    if (lVar11 != newsize) {
      lVar7 = (this->super_TPZVec<float>).fNAlloc;
      if (lVar7 < newsize) {
        if (newsize < 0x3e9) {
          if (lVar11 < 1) {
            lVar11 = 0;
          }
          else {
            pfVar6 = (this->super_TPZVec<float>).fStore;
            lVar7 = 0;
            do {
              this->fExtAlloc[lVar7] = pfVar6[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar11 != lVar7);
          }
          if (lVar11 < newsize) {
            do {
              this->fExtAlloc[lVar11] = *object;
              lVar11 = lVar11 + 1;
            } while (newsize != lVar11);
          }
          pfVar6 = (this->super_TPZVec<float>).fStore;
          if (pfVar6 != (float *)0x0 && pfVar6 != this->fExtAlloc) {
            operator_delete__(pfVar6);
          }
          (this->super_TPZVec<float>).fStore = this->fExtAlloc;
          (this->super_TPZVec<float>).fNElements = newsize;
          (this->super_TPZVec<float>).fNAlloc = 1000;
        }
        else {
          dVar12 = (double)lVar7 * 1.2;
          uVar8 = (long)dVar12;
          if (dVar12 < (double)newsize) {
            uVar8 = newsize;
          }
          pfVar6 = (float *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4);
          lVar7 = 0;
          if (0 < lVar11) {
            pfVar2 = (this->super_TPZVec<float>).fStore;
            lVar9 = 0;
            do {
              pfVar6[lVar9] = pfVar2[lVar9];
              lVar9 = lVar9 + 1;
              lVar7 = lVar11;
            } while (lVar11 != lVar9);
          }
          auVar5 = _DAT_014f8b30;
          auVar4 = _DAT_014f8350;
          auVar3 = _DAT_014f8340;
          lVar11 = newsize - lVar7;
          if (lVar11 != 0 && lVar7 <= newsize) {
            fVar1 = *object;
            lVar9 = lVar11 + -1;
            auVar13._8_4_ = (int)lVar9;
            auVar13._0_8_ = lVar9;
            auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
            uVar10 = 0;
            auVar13 = auVar13 ^ _DAT_014f8350;
            do {
              auVar15._8_4_ = (int)uVar10;
              auVar15._0_8_ = uVar10;
              auVar15._12_4_ = (int)(uVar10 >> 0x20);
              auVar16 = (auVar15 | auVar3) ^ auVar4;
              iVar14 = auVar13._4_4_;
              if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                          iVar14 < auVar16._4_4_) & 1)) {
                pfVar6[lVar7 + uVar10] = fVar1;
              }
              if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
                  auVar16._12_4_ <= auVar13._12_4_) {
                pfVar6[lVar7 + uVar10 + 1] = fVar1;
              }
              auVar15 = (auVar15 | auVar5) ^ auVar4;
              iVar17 = auVar15._4_4_;
              if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar15._0_4_ <= auVar13._0_4_)) {
                pfVar6[lVar7 + uVar10 + 2] = fVar1;
                pfVar6[lVar7 + uVar10 + 3] = fVar1;
              }
              uVar10 = uVar10 + 4;
            } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar10);
          }
          pfVar2 = (this->super_TPZVec<float>).fStore;
          if (pfVar2 != (float *)0x0 && pfVar2 != this->fExtAlloc) {
            operator_delete__(pfVar2);
          }
          (this->super_TPZVec<float>).fStore = pfVar6;
          (this->super_TPZVec<float>).fNElements = newsize;
          (this->super_TPZVec<float>).fNAlloc = uVar8;
        }
      }
      else {
        if (lVar11 < newsize) {
          pfVar6 = (this->super_TPZVec<float>).fStore;
          do {
            pfVar6[lVar11] = *object;
            lVar11 = lVar11 + 1;
          } while (newsize != lVar11);
        }
        (this->super_TPZVec<float>).fNElements = newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}